

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue_examples.cpp
# Opt level: O0

void density_tests::heterogeneous_queue_reentrant_put_transaction_samples(void)

{
  void **ppvVar1;
  bool bVar2;
  int *piVar3;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *phVar4;
  difference_type dVar5;
  ostream *poVar6;
  runtime_type<> *prVar7;
  type_info *ptVar8;
  char *pcVar9;
  double *pdVar10;
  bool local_4a9;
  double local_488;
  reentrant_put_transaction<double> local_480;
  undefined1 local_468 [8];
  reentrant_put_transaction<double> typed_put;
  reentrant_put_transaction<void> local_448;
  undefined1 local_430 [8];
  reentrant_put_transaction<void> untyped_put;
  undefined1 local_410 [4];
  int value_2;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_12;
  reentrant_put_transaction<int> local_3f8;
  undefined1 local_3e0 [8];
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_11;
  reentrant_put_transaction<void> local_3c8;
  undefined1 local_3b0 [8];
  reentrant_put_transaction<void> put_3;
  undefined1 local_390 [4];
  int value_1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_10;
  reentrant_put_transaction<int> local_378;
  undefined1 local_360 [8];
  reentrant_put_transaction<int> put_1;
  reentrant_put_transaction<void> local_340;
  undefined1 local_328 [8];
  reentrant_put_transaction<void> put_2;
  undefined1 local_308 [4];
  int value;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_9;
  const_iterator local_2d8;
  int local_2b4;
  reentrant_put_transaction<int> local_2b0;
  int local_294;
  reentrant_put_transaction<int> local_290;
  undefined1 local_278 [8];
  reentrant_put_transaction<int> put;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_8;
  reentrant_put_transaction<int> local_248;
  undefined1 local_230 [8];
  reentrant_put_transaction<void> transaction_3;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_7;
  reentrant_put_transaction<int> local_200;
  undefined1 local_1e8 [8];
  reentrant_put_transaction<void> transaction_2;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_6;
  reentrant_put_transaction<int> local_1b8;
  undefined1 local_1a0 [8];
  reentrant_put_transaction<void> transaction_1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_5;
  anon_class_8_1_a8890831 post_message_2;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_4;
  anon_class_8_1_a8890831 post_message_1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_3;
  int msg_2;
  int msg_1;
  anon_class_16_2_e5d92710 consume_all_msgs;
  time_point start_time;
  anon_class_8_1_a8890831 post_message;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_2;
  reentrant_put_transaction<int> local_108;
  undefined1 local_f0 [8];
  reentrant_put_transaction<void> transaction2_1;
  reentrant_put_transaction<int> local_d0;
  undefined1 local_b8 [8];
  reentrant_put_transaction<int> transaction1_1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue_1;
  type transaction2;
  int local_64;
  reentrant_put_transaction<int> local_60;
  undefined1 local_48 [8];
  reentrant_put_transaction<int> transaction1;
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> queue;
  reentrant_put_transaction<void> transaction;
  
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&queue.m_tail);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<void>::empty((reentrant_put_transaction<void> *)&queue.m_tail)
  ;
  if (!bVar2) {
    __assert_fail("transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x325,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)&queue.m_tail);
  ppvVar1 = &transaction1.m_put_data.m_user_storage;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              ppvVar1);
  local_64 = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_60,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             ppvVar1,&local_64);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)local_48,&local_60);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_60);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)&queue_1.m_tail,
             (reentrant_put_transaction<int> *)local_48);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<int>::empty((reentrant_put_transaction<int> *)local_48);
  if (!bVar2) {
    __assert_fail("transaction1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x340,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  piVar3 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<int>::element<int,_nullptr>
                     ((reentrant_put_transaction<int> *)&queue_1.m_tail);
  if (*piVar3 != 1) {
    __assert_fail("transaction2.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x341,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::commit((reentrant_put_transaction<int> *)&queue_1.m_tail);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<int>::empty((reentrant_put_transaction<int> *)&queue_1.m_tail)
  ;
  if (!bVar2) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x345,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)&queue_1.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_48);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &transaction1.m_put_data.m_user_storage);
  ppvVar1 = &transaction1_1.m_put_data.m_user_storage;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              ppvVar1);
  transaction2_1.m_put_data.m_user_storage._4_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_d0,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             ppvVar1,(int *)((long)&transaction2_1.m_put_data.m_user_storage + 4));
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)local_b8,&local_d0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_d0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::reentrant_put_transaction
            ((reentrant_put_transaction<void> *)local_f0);
  queue_2.m_tail._4_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_108,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &transaction1_1.m_put_data.m_user_storage,(int *)((long)&queue_2.m_tail + 4));
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=((reentrant_put_transaction<void> *)local_f0,&local_108)
  ;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_108);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)local_f0,(reentrant_put_transaction<int> *)local_b8)
  ;
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<int>::empty((reentrant_put_transaction<int> *)local_b8);
  if (!bVar2) {
    __assert_fail("transaction1.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x370,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::commit((reentrant_put_transaction<void> *)local_f0);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<void>::empty((reentrant_put_transaction<void> *)local_f0);
  if (!bVar2) {
    __assert_fail("transaction2.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x372,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)local_f0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_b8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &transaction1_1.m_put_data.m_user_storage);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &post_message);
  start_time.__d.__r = (duration)(duration)&post_message;
  consume_all_msgs.start_time = (time_point *)std::chrono::_V2::system_clock::now();
  consume_all_msgs.queue =
       (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
       &consume_all_msgs.start_time;
  queue_3.m_tail._4_4_ = 0x2a;
  queue_3.m_tail._0_4_ = 0x237;
  _msg_2 = (rep)&post_message;
  heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&start_time,(void *)((long)&queue_3.m_tail + 4),4);
  heterogeneous_queue_reentrant_put_transaction_samples::anon_class_8_1_a8890831::operator()
            ((anon_class_8_1_a8890831 *)&start_time,&queue_3.m_tail,4);
  heterogeneous_queue_reentrant_put_transaction_samples::anon_class_16_2_e5d92710::operator()
            ((anon_class_16_2_e5d92710 *)&msg_2);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &post_message);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &post_message_1);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &post_message_1);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &post_message_2);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &post_message_2);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &transaction_1.m_put_data.m_user_storage);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::reentrant_put_transaction
            ((reentrant_put_transaction<void> *)local_1a0);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<void>::empty((reentrant_put_transaction<void> *)local_1a0);
  if (!bVar2) {
    __assert_fail("transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3e6,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  queue_6.m_tail._4_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_1b8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &transaction_1.m_put_data.m_user_storage,(int *)((long)&queue_6.m_tail + 4));
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)local_1a0,&local_1b8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_1b8);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<void>::empty((reentrant_put_transaction<void> *)local_1a0);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!transaction.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3e9,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)local_1a0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &transaction_1.m_put_data.m_user_storage);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &transaction_2.m_put_data.m_user_storage);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::reentrant_put_transaction
            ((reentrant_put_transaction<void> *)local_1e8);
  bVar2 = density::heter_queue::reentrant_put_transaction::operator_cast_to_bool
                    ((reentrant_put_transaction *)local_1e8);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3f0,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  queue_7.m_tail._4_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_200,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &transaction_2.m_put_data.m_user_storage,(int *)((long)&queue_7.m_tail + 4));
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)local_1e8,&local_200);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_200);
  bVar2 = density::heter_queue::reentrant_put_transaction::operator_cast_to_bool
                    ((reentrant_put_transaction *)local_1e8);
  if (!bVar2) {
    __assert_fail("transaction",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3f3,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)local_1e8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &transaction_2.m_put_data.m_user_storage);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &transaction_3.m_put_data.m_user_storage);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::reentrant_put_transaction
            ((reentrant_put_transaction<void> *)local_230);
  phVar4 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<void>::queue((reentrant_put_transaction<void> *)local_230);
  if (phVar4 != (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                0x0) {
    __assert_fail("transaction.queue() == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3fa,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  queue_8.m_tail._4_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_248,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &transaction_3.m_put_data.m_user_storage,(int *)((long)&queue_8.m_tail + 4));
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::operator=
            ((reentrant_put_transaction<void> *)local_230,&local_248);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_248);
  phVar4 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<void>::queue((reentrant_put_transaction<void> *)local_230);
  if (phVar4 != (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
                &transaction_3.m_put_data.m_user_storage) {
    __assert_fail("transaction.queue() == &queue",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x3fd,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)local_230);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &transaction_3.m_put_data.m_user_storage);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              &put.m_put_data.m_user_storage);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&put.m_put_data.m_user_storage);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x405,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  local_294 = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_290,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &put.m_put_data.m_user_storage,&local_294);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)local_278,&local_290);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_290);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_put_transaction<int>::empty((reentrant_put_transaction<int> *)local_278);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x409,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::cancel((reentrant_put_transaction<int> *)local_278);
  bVar2 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
          ::empty((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
                   *)&put.m_put_data.m_user_storage);
  local_4a9 = false;
  if (bVar2) {
    local_4a9 = density::
                heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                reentrant_put_transaction<int>::empty((reentrant_put_transaction<int> *)local_278);
  }
  if (local_4a9 == false) {
    __assert_fail("queue.empty() && put.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x40b,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  local_2b4 = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_2b0,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             &put.m_put_data.m_user_storage,&local_2b4);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<int>::operator=((reentrant_put_transaction<int> *)local_278,&local_2b0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_2b0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::commit((reentrant_put_transaction<int> *)local_278);
  ppvVar1 = &put.m_put_data.m_user_storage;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cbegin
            (&local_2d8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             ppvVar1);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::cend
            ((const_iterator *)&queue_9.m_tail,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             ppvVar1);
  dVar5 = std::
          distance<density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::const_iterator>
                    (&local_2d8,(const_iterator *)&queue_9.m_tail);
  if (dVar5 != 1) {
    __assert_fail("std::distance(queue.cbegin(), queue.cend()) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x410,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator((const_iterator *)&queue_9.m_tail);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  const_iterator::~const_iterator(&local_2d8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_278);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               &put.m_put_data.m_user_storage);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_308);
  put_2.m_put_data.m_user_storage._4_4_ = 0x2a;
  put_1.m_put_data.m_user_storage = (void *)density::runtime_type<>::make<int>();
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_dyn_push_copy
            (&local_340,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_308,(runtime_type<> *)&put_1.m_put_data.m_user_storage,
             (void *)((long)&put_2.m_put_data.m_user_storage + 4));
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
            ((reentrant_put_transaction<void> *)local_328,&local_340);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction(&local_340);
  piVar3 = (int *)density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_put_transaction<void>::element_ptr
                            ((reentrant_put_transaction<void> *)local_328);
  if (*piVar3 != 0x2a) {
    __assert_fail("*static_cast<int *>(put.element_ptr()) == 42",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x419,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Putting an ");
  prVar7 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<void>::complete_type
                     ((reentrant_put_transaction<void> *)local_328);
  ptVar8 = density::runtime_type<>::type_info(prVar7);
  pcVar9 = std::type_info::name(ptVar8);
  poVar6 = std::operator<<(poVar6,pcVar9);
  poVar6 = std::operator<<(poVar6,"...");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  queue_10.m_tail._4_4_ = 1;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_378,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_308,(int *)((long)&queue_10.m_tail + 4));
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<int>::reentrant_put_transaction<int,void>
            ((reentrant_put_transaction<int> *)local_360,&local_378);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_378);
  piVar3 = (int *)density::
                  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
                  reentrant_put_transaction<int>::element_ptr
                            ((reentrant_put_transaction<int> *)local_360);
  if (*piVar3 != 1) {
    __assert_fail("*static_cast<int *>(put_1.element_ptr()) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x421,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  piVar3 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<int>::element<int,_nullptr>
                     ((reentrant_put_transaction<int> *)local_360);
  if (*piVar3 != 1) {
    __assert_fail("put_1.element() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x422,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction
            ((reentrant_put_transaction<int> *)local_360);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)local_328);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_308);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_390);
  put_3.m_put_data.m_user_storage._4_4_ = 0x2a;
  queue_11.m_tail = (ControlBlock *)density::runtime_type<>::make<int>();
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_dyn_push_copy
            (&local_3c8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_390,(runtime_type<> *)&queue_11.m_tail,
             (void *)((long)&put_3.m_put_data.m_user_storage + 4));
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
            ((reentrant_put_transaction<void> *)local_3b0,&local_3c8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction(&local_3c8);
  prVar7 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<void>::complete_type
                     ((reentrant_put_transaction<void> *)local_3b0);
  bVar2 = density::runtime_type<>::is<int>(prVar7);
  if (!bVar2) {
    __assert_fail("put.complete_type().is<int>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                  ,0x42b,
                  "void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()");
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"Putting an ");
  prVar7 = density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<void>::complete_type
                     ((reentrant_put_transaction<void> *)local_3b0);
  ptVar8 = density::runtime_type<>::type_info(prVar7);
  pcVar9 = std::type_info::name(ptVar8);
  poVar6 = std::operator<<(poVar6,pcVar9);
  poVar6 = std::operator<<(poVar6,"...");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction
            ((reentrant_put_transaction<void> *)local_3b0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_390);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_3e0);
  queue_12.m_tail._4_4_ = 0x2a;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<int>
            (&local_3f8,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_3e0,(int *)((long)&queue_12.m_tail + 4));
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<int>::~reentrant_put_transaction(&local_3f8);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
               local_3e0);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
              local_410);
  untyped_put.m_put_data.m_user_storage._4_4_ = 0x2a;
  typed_put.m_put_data.m_user_storage = (void *)density::runtime_type<>::make<int>();
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_dyn_push_copy
            (&local_448,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_410,(runtime_type<> *)&typed_put.m_put_data.m_user_storage,
             (void *)((long)&untyped_put.m_put_data.m_user_storage + 4));
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<void>::reentrant_put_transaction<void,void>
            ((reentrant_put_transaction<void> *)local_430,&local_448);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<void>::~reentrant_put_transaction(&local_448);
  local_488 = 42.0;
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  start_reentrant_push<double>
            (&local_480,
             (heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *)
             local_410,&local_488);
  density::heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<double>::reentrant_put_transaction<double,void>
            ((reentrant_put_transaction<double> *)local_468,&local_480);
  density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<double>::~reentrant_put_transaction(&local_480);
  pdVar10 = density::
            heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
            reentrant_put_transaction<double>::element<double,_nullptr>
                      ((reentrant_put_transaction<double> *)local_468);
  if ((*pdVar10 == 42.0) && (!NAN(*pdVar10))) {
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<double>::~reentrant_put_transaction
              ((reentrant_put_transaction<double> *)local_468);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    reentrant_put_transaction<void>::~reentrant_put_transaction
              ((reentrant_put_transaction<void> *)local_430);
    density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
    ~heter_queue((heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_> *
                 )local_410);
    return;
  }
  __assert_fail("typed_put.element() == 42.",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/heter_queue_examples.cpp"
                ,0x445,"void density_tests::heterogeneous_queue_reentrant_put_transaction_samples()"
               );
}

Assistant:

void heterogeneous_queue_reentrant_put_transaction_samples()
    {
        using namespace density;
        {
            //! [heter_queue reentrant_put_transaction default_construct example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(transaction.empty());
            //! [heter_queue reentrant_put_transaction default_construct example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction copy_construct example 1]
            static_assert(
              !std::is_copy_constructible<heter_queue<>::reentrant_put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_constructible<heter_queue<int>::reentrant_put_transaction<>>::value,
              "");
            //! [heter_queue reentrant_put_transaction copy_construct example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction copy_assign example 1]
            static_assert(
              !std::is_copy_assignable<heter_queue<>::reentrant_put_transaction<>>::value, "");
            static_assert(
              !std::is_copy_assignable<heter_queue<int>::reentrant_put_transaction<>>::value, "");
            //! [heter_queue reentrant_put_transaction copy_assign example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction move_construct example 1]
            heter_queue<> queue;
            auto          transaction1 = queue.start_reentrant_push(1);

            // move from transaction1 to transaction2
            auto transaction2(std::move(transaction1));
            assert(transaction1.empty());
            assert(transaction2.element() == 1);

            // commit transaction2
            transaction2.commit();
            assert(transaction2.empty());

            //! [heter_queue reentrant_put_transaction move_construct example 1]

            //! [heter_queue reentrant_put_transaction move_construct example 2]
            // reentrant_put_transaction<void> can be move constructed from any reentrant_put_transaction<T>
            static_assert(
              std::is_constructible<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");

            // reentrant_put_transaction<T> can be move constructed only from reentrant_put_transaction<T>
            static_assert(
              !std::is_constructible<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_constructible<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_constructible<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");
            //! [heter_queue reentrant_put_transaction move_construct example 2]
        }
        {
            //! [heter_queue reentrant_put_transaction move_assign example 1]
            heter_queue<> queue;
            auto          transaction1 = queue.start_reentrant_push(1);

            heter_queue<>::reentrant_put_transaction<> transaction2;
            transaction2 = queue.start_reentrant_push(1);
            transaction2 = std::move(transaction1);
            assert(transaction1.empty());
            transaction2.commit();
            assert(transaction2.empty());
            //! [heter_queue reentrant_put_transaction move_assign example 1]

            //! [heter_queue reentrant_put_transaction move_assign example 2]
            // reentrant_put_transaction<void> can be move assigned from any reentrant_put_transaction<T>
            static_assert(
              std::is_assignable<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                heter_queue<>::reentrant_put_transaction<void>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");

            // reentrant_put_transaction<T> can be move assigned only from reentrant_put_transaction<T>
            static_assert(
              !std::is_assignable<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<void> &&>::value,
              "");
            static_assert(
              !std::is_assignable<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<float> &&>::value,
              "");
            static_assert(
              std::is_assignable<
                heter_queue<>::reentrant_put_transaction<int>,
                heter_queue<>::reentrant_put_transaction<int> &&>::value,
              "");
            //! [heter_queue reentrant_put_transaction move_assign example 2]
        }
        {
            //! [heter_queue reentrant_put_transaction raw_allocate example 1]
            heter_queue<> queue;
            struct Msg
            {
                std::chrono::high_resolution_clock::time_point m_time =
                  std::chrono::high_resolution_clock::now();
                size_t m_len  = 0;
                void * m_data = nullptr;
            };

            auto post_message = [&queue](const void * i_data, size_t i_len) {
                auto transaction             = queue.start_reentrant_emplace<Msg>();
                transaction.element().m_len  = i_len;
                transaction.element().m_data = transaction.raw_allocate(i_len, 1);
                memcpy(transaction.element().m_data, i_data, i_len);

                assert(
                  !transaction
                     .empty()); // a put transaction is not empty if it's bound to an element being put
                transaction.commit();
                assert(transaction.empty()); // the commit makes the transaction empty
            };

            auto const start_time = std::chrono::high_resolution_clock::now();

            auto consume_all_msgs = [&queue, &start_time] {
                while (auto consume = queue.try_start_reentrant_consume())
                {
                    auto const checksum =
                      compute_checksum(consume.element<Msg>().m_data, consume.element<Msg>().m_len);
                    std::cout << "Message with checksum " << checksum << " at ";
                    std::cout << (consume.element<Msg>().m_time - start_time).count() << std::endl;
                    consume.commit();
                }
            };

            int msg_1 = 42, msg_2 = 567;
            post_message(&msg_1, sizeof(msg_1));
            post_message(&msg_2, sizeof(msg_2));

            consume_all_msgs();
            //! [heter_queue reentrant_put_transaction raw_allocate example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 1]
            struct Msg
            {
                size_t m_len   = 0;
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const char * i_data, size_t i_len) {
                auto transaction            = queue.start_reentrant_emplace<Msg>();
                transaction.element().m_len = i_len;
                transaction.element().m_chars =
                  transaction.raw_allocate_copy(i_data, i_data + i_len);
                memcpy(transaction.element().m_chars, i_data, i_len);
                transaction.commit();
            };
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 1]
            (void)post_message;
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 2]
            struct Msg
            {
                char * m_chars = nullptr;
            };
            auto post_message = [&queue](const std::string & i_string) {
                auto transaction              = queue.start_reentrant_emplace<Msg>();
                transaction.element().m_chars = transaction.raw_allocate_copy(i_string);
                transaction.commit();
            };
            //! [heter_queue reentrant_put_transaction raw_allocate_copy example 2]
            (void)post_message;
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction empty example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(transaction.empty());

            transaction = queue.start_reentrant_push(1);
            assert(!transaction.empty());
            //! [heter_queue reentrant_put_transaction empty example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction operator_bool example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(!transaction);

            transaction = queue.start_reentrant_push(1);
            assert(transaction);
            //! [heter_queue reentrant_put_transaction operator_bool example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction queue example 1]
            heter_queue<>::reentrant_put_transaction<> transaction;
            assert(transaction.queue() == nullptr);

            transaction = queue.start_reentrant_push(1);
            assert(transaction.queue() == &queue);
            //! [heter_queue reentrant_put_transaction queue example 1]
        }
        {
            //! [heter_queue reentrant_put_transaction cancel example 1]
            heter_queue<> queue;

            // start and cancel a put
            assert(queue.empty());
            auto put = queue.start_reentrant_push(42);
            /* assert(queue.empty()); <- this assert would trigger an undefined behavior, because it would access
        the queue during a non-reentrant put transaction. */
            assert(!put.empty());
            put.cancel();
            assert(queue.empty() && put.empty());

            // start and commit a put
            put = queue.start_reentrant_push(42);
            put.commit();
            assert(std::distance(queue.cbegin(), queue.cend()) == 1);
            //! [heter_queue reentrant_put_transaction cancel example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction element_ptr example 1]
            int  value = 42;
            auto put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(*static_cast<int *>(put.element_ptr()) == 42);
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;

            //! [heter_queue reentrant_put_transaction element_ptr example 1]

            //! [heter_queue reentrant_put_transaction element_ptr example 2]
            auto put_1 = queue.start_reentrant_push(1);
            assert(*static_cast<int *>(put_1.element_ptr()) == 1); // this is fine
            assert(put_1.element() == 1);                          // this is better
            //! [heter_queue reentrant_put_transaction element_ptr example 2]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction complete_type example 1]
            int  value = 42;
            auto put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);
            assert(put.complete_type().is<int>());
            std::cout << "Putting an " << put.complete_type().type_info().name() << "..."
                      << std::endl;
            //! [heter_queue reentrant_put_transaction complete_type example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_put_transaction destroy example 1]
            queue.start_reentrant_push(
              42); /* this transaction is destroyed without being committed,
                            so it gets canceled automatically. */
            //! [heter_queue reentrant_put_transaction destroy example 1]
        }
        {
            heter_queue<> queue;
            //! [heter_queue reentrant_typed_put_transaction element example 1]

            int  value = 42;
            auto untyped_put =
              queue.start_reentrant_dyn_push_copy(runtime_type<>::make<decltype(value)>(), &value);

            auto typed_put = queue.start_reentrant_push(42.);

            /* typed_put = std::move(untyped_put); <- this would not compile: can't assign an untyped
        transaction to a typed transaction */

            assert(typed_put.element() == 42.);

            //! [heter_queue reentrant_typed_put_transaction element example 1]
        }
    }